

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O0

void ggml_backend_multi_buffer_clear(ggml_backend_buffer_t buffer,uint8_t value)

{
  long lVar1;
  long in_RDI;
  size_t i;
  ggml_backend_multi_buffer_context *ctx;
  uint8_t in_stack_ffffffffffffffdf;
  ggml_backend_buffer_t buffer_00;
  
  lVar1 = *(long *)(in_RDI + 0x50);
  for (buffer_00 = (ggml_backend_buffer_t)0x0; buffer_00 < *(ggml_backend_buffer_t *)(lVar1 + 8);
      buffer_00 = (ggml_backend_buffer_t)((long)&(buffer_00->iface).free_buffer + 1)) {
    ggml_backend_buffer_clear(buffer_00,in_stack_ffffffffffffffdf);
  }
  return;
}

Assistant:

static void ggml_backend_multi_buffer_clear(ggml_backend_buffer_t buffer, uint8_t value) {
    ggml_backend_multi_buffer_context * ctx = (ggml_backend_multi_buffer_context *) buffer->context;
    for (size_t i = 0; i < ctx->n_buffers; i++) {
        ggml_backend_buffer_clear(ctx->buffers[i], value);
    }
}